

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3OffsetsFunc(sqlite3_context *pContext,int nVal,sqlite3_value **apVal)

{
  int iVar1;
  Fts3Cursor *local_28;
  Fts3Cursor *pCsr;
  sqlite3_value **apVal_local;
  sqlite3_context *psStack_10;
  int nVal_local;
  sqlite3_context *pContext_local;
  
  pCsr = (Fts3Cursor *)apVal;
  apVal_local._4_4_ = nVal;
  psStack_10 = pContext;
  iVar1 = fts3FunctionArg(pContext,"offsets",*apVal,&local_28);
  if ((iVar1 == 0) && (iVar1 = fts3CursorSeek(psStack_10,local_28), iVar1 == 0)) {
    sqlite3Fts3Offsets(psStack_10,local_28);
  }
  return;
}

Assistant:

static void fts3OffsetsFunc(
  sqlite3_context *pContext,      /* SQLite function call context */
  int nVal,                       /* Size of argument array */
  sqlite3_value **apVal           /* Array of arguments */
){
  Fts3Cursor *pCsr;               /* Cursor handle passed through apVal[0] */

  UNUSED_PARAMETER(nVal);

  assert( nVal==1 );
  if( fts3FunctionArg(pContext, "offsets", apVal[0], &pCsr) ) return;
  assert( pCsr );
  if( SQLITE_OK==fts3CursorSeek(pContext, pCsr) ){
    sqlite3Fts3Offsets(pContext, pCsr);
  }
}